

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

json * __thiscall argo::json::operator[](json *this,string *name)

{
  bool bVar1;
  json *this_00;
  mapped_type *this_01;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> *this_02;
  pointer ppVar2;
  json_exception *this_03;
  char *json_type_name;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> local_38;
  _Self local_30;
  _Self local_28;
  iterator i;
  string *name_local;
  json *this_local;
  
  i._M_node = (_Base_ptr)name;
  if (this->m_type == object_e) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
         ::find(&(this->m_value).u_object,name);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
         ::end(&(this->m_value).u_object);
    bVar1 = std::operator==(&local_28,&local_30);
    if (bVar1) {
      this_00 = (json *)operator_new(0x58);
      json(this_00);
      std::unique_ptr<argo::json,std::default_delete<argo::json>>::
      unique_ptr<std::default_delete<argo::json>,void>
                ((unique_ptr<argo::json,std::default_delete<argo::json>> *)&local_38,this_00);
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
                ::operator[](&(this->m_value).u_object,(key_type *)i._M_node);
      this_02 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator=
                          (this_01,&local_38);
      this_local = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*(this_02)
      ;
      std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&local_38);
    }
    else {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
               ::operator->(&local_28);
      this_local = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*
                             (&ppVar2->second);
    }
    return this_local;
  }
  this_03 = (json_exception *)__cxa_allocate_exception(0xd8);
  json_type_name = get_instance_type_name(this);
  json_exception::json_exception(this_03,not_an_object_e,json_type_name);
  __cxa_throw(this_03,&json_exception::typeinfo,json_exception::~json_exception);
}

Assistant:

json &json::operator[](const string &name)
{
    if (m_type == object_e)
    {
        auto i = m_value.u_object.find(name);
        if (i == m_value.u_object.end())
        {
            return *((m_value.u_object)[name] = unique_ptr<json>(new json));
        }
        else
        {
            return *(i->second);
        }
    }
    else
    {
        throw json_exception(json_exception::not_an_object_e, get_instance_type_name());
    }
}